

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O3

void * lzham::task_pool::thread_func(void *pContext)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  undefined8 uVar6;
  code *pcVar7;
  undefined8 uVar8;
  
  iVar2 = sem_wait((sem_t *)((long)pContext + 0x298));
  if (iVar2 == 0) {
    uVar1 = 0;
    uVar6 = 0;
    pcVar7 = (code *)0x0;
    uVar8 = 0;
    do {
      if (*(long *)((long)pContext + 0x2c0) != 0) {
        return (void *)0x0;
      }
      iVar2 = pthread_spin_lock((pthread_spinlock_t *)pContext);
      if (iVar2 != 0) {
        lzham_fail("\"spinlock: pthread_spin_lock() failed\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
                   ,0x72);
      }
      iVar2 = *(int *)((long)pContext + 0x208);
      if (0 < iVar2) {
        *(uint *)((long)pContext + 0x208) = iVar2 - 1U;
        lVar4 = (ulong)(iVar2 - 1U) * 0x20;
        uVar6 = *(undefined8 *)((long)pContext + lVar4 + 8);
        uVar8 = *(undefined8 *)((long)pContext + lVar4 + 0x10);
        pcVar7 = *(code **)((long)pContext + lVar4 + 0x18);
        uVar1 = *(uint *)((long)pContext + lVar4 + 0x20);
      }
      iVar3 = pthread_spin_unlock((pthread_spinlock_t *)pContext);
      if (iVar3 != 0) {
        lzham_fail("\"spinlock: pthread_spin_unlock() failed\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
                   ,0x7a);
      }
      if (0 < iVar2) {
        if ((uVar1 & 1) == 0) {
          (*pcVar7)(uVar6,uVar8);
        }
        else {
          (*(code *)**(undefined8 **)pcVar7)(pcVar7,uVar6,uVar8);
        }
        LOCK();
        *(long *)((long)pContext + 0x2b8) = *(long *)((long)pContext + 0x2b8) + -1;
        UNLOCK();
      }
      iVar2 = sem_wait((sem_t *)((long)pContext + 0x298));
    } while (iVar2 == 0);
  }
  piVar5 = __errno_location();
  if (*piVar5 != 0x6e) {
    lzham_fail("\"semaphore: sem_wait() or sem_timedwait() failed\"",
               "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
               ,0x52);
  }
  return (void *)0x0;
}

Assistant:

void * task_pool::thread_func(void *pContext)
   {
      task_pool* pPool = static_cast<task_pool*>(pContext);
      task tsk;

      for ( ; ; )
      {
         if (!pPool->m_tasks_available.wait())
            break;

         if (pPool->m_exit_flag)
            break;

         if (pPool->m_task_stack.pop(tsk))
         {
            pPool->process_task(tsk);
         }
      }

      return NULL;
   }